

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O0

int gcm_gen_table(mbedtls_gcm_context *ctx)

{
  ulong uVar1;
  mbedtls_gcm_context *in_RDI;
  size_t olen;
  uint8_t *h;
  uint64_t u64h [2];
  int j;
  int i;
  int ret;
  uint64_t x;
  size_t i_1;
  uint64_t r_1;
  uint64_t r;
  size_t *in_stack_ffffffffffffff48;
  uchar *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar2;
  undefined4 in_stack_ffffffffffffff68;
  int iVar3;
  undefined4 in_stack_ffffffffffffff6c;
  int local_84;
  ulong local_58;
  
  memset(&stack0xffffffffffffff48,0,0x10);
  local_84 = mbedtls_cipher_update
                       ((mbedtls_cipher_context_t *)
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                        (uchar *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                        in_stack_ffffffffffffff48);
  if (local_84 == 0) {
    gcm_set_acceleration(in_RDI);
    in_RDI->H[8][0] = (uint64_t)in_stack_ffffffffffffff48;
    in_RDI->H[8][1] = (uint64_t)in_stack_ffffffffffffff50;
    in_RDI->H[0][0] = 0;
    in_RDI->H[0][1] = 0;
    for (iVar3 = 4; 0 < iVar3; iVar3 = iVar3 >> 1) {
      gcm_gen_table_rightshift(in_RDI->H[iVar3],in_RDI->H[iVar3 << 1]);
    }
    for (iVar3 = 8; iVar3 != 0; iVar3 = iVar3 >> 1) {
      uVar1 = in_RDI->H[iVar3][0];
      in_RDI->H[iVar3][0] =
           uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
           (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
           (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      uVar1 = in_RDI->H[iVar3][1];
      in_RDI->H[iVar3][1] =
           uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
           (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
           (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    }
    for (iVar3 = 2; iVar3 < 0x10; iVar3 = iVar3 << 1) {
      for (iVar2 = 1; iVar2 < iVar3; iVar2 = iVar2 + 1) {
        for (local_58 = 0; local_58 + 8 < 0x11; local_58 = local_58 + 8) {
          *(ulong *)((long)in_RDI->H[iVar3 + iVar2] + local_58) =
               *(ulong *)((long)in_RDI->H[iVar3] + local_58) ^
               *(ulong *)((long)in_RDI->H[iVar2] + local_58);
        }
        for (; local_58 < 0x10; local_58 = local_58 + 1) {
          *(byte *)((long)in_RDI->H[iVar3 + iVar2] + local_58) =
               *(byte *)((long)in_RDI->H[iVar3] + local_58) ^
               *(byte *)((long)in_RDI->H[iVar2] + local_58);
        }
      }
    }
    local_84 = 0;
  }
  return local_84;
}

Assistant:

static int gcm_gen_table(mbedtls_gcm_context *ctx)
{
    int ret, i, j;
    uint64_t u64h[2] = { 0 };
    uint8_t *h = (uint8_t *) u64h;

#if defined(MBEDTLS_BLOCK_CIPHER_C)
    ret = mbedtls_block_cipher_encrypt(&ctx->block_cipher_ctx, h, h);
#else
    size_t olen = 0;
    ret = mbedtls_cipher_update(&ctx->cipher_ctx, h, 16, h, &olen);
#endif
    if (ret != 0) {
        return ret;
    }

    gcm_set_acceleration(ctx);

    /* MBEDTLS_GCM_HTABLE_SIZE/2 = 1000 corresponds to 1 in GF(2^128) */
    ctx->H[MBEDTLS_GCM_HTABLE_SIZE/2][0] = u64h[0];
    ctx->H[MBEDTLS_GCM_HTABLE_SIZE/2][1] = u64h[1];

    switch (ctx->acceleration) {
#if defined(MBEDTLS_AESNI_HAVE_CODE)
        case MBEDTLS_GCM_ACC_AESNI:
            return 0;
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
        case MBEDTLS_GCM_ACC_AESCE:
            return 0;
#endif

        default:
            /* 0 corresponds to 0 in GF(2^128) */
            ctx->H[0][0] = 0;
            ctx->H[0][1] = 0;

            for (i = MBEDTLS_GCM_HTABLE_SIZE/4; i > 0; i >>= 1) {
                gcm_gen_table_rightshift(ctx->H[i], ctx->H[i*2]);
            }

#if !defined(MBEDTLS_GCM_LARGE_TABLE)
            /* pack elements of H as 64-bits ints, big-endian */
            for (i = MBEDTLS_GCM_HTABLE_SIZE/2; i > 0; i >>= 1) {
                MBEDTLS_PUT_UINT64_BE(ctx->H[i][0], &ctx->H[i][0], 0);
                MBEDTLS_PUT_UINT64_BE(ctx->H[i][1], &ctx->H[i][1], 0);
            }
#endif

            for (i = 2; i < MBEDTLS_GCM_HTABLE_SIZE; i <<= 1) {
                for (j = 1; j < i; j++) {
                    mbedtls_xor_no_simd((unsigned char *) ctx->H[i+j],
                                        (unsigned char *) ctx->H[i],
                                        (unsigned char *) ctx->H[j],
                                        16);
                }
            }
    }

    return 0;
}